

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

Abc_Ntk_t * Abc_SclBufferingPerform(Abc_Ntk_t *pNtk,SC_Lib *pLib,SC_BusPars *pPars)

{
  int iVar1;
  Bus_Man_t *p;
  Abc_Ntk_t *pAVar2;
  int Fill;
  
  iVar1 = Abc_SclCheckNtk(pNtk,0);
  if (iVar1 != 0) {
    Abc_SclReportDupFanins(pNtk);
    Abc_SclMioGates2SclGates(pLib,pNtk);
    p = Bus_ManStart(pNtk,pLib,pPars);
    Bus_ManReadInOutLoads(p);
    Abc_SclBufSize(p,(float)pPars->GainRatio * 0.01);
    Bus_ManStop(p);
    Abc_SclSclGates2MioGates(pLib,pNtk);
    if (pNtk->vPhases != (Vec_Int_t *)0x0) {
      Vec_IntFillExtra(pNtk->vPhases,pNtk->vObjs->nSize,Fill);
    }
    pAVar2 = Abc_NtkDupDfs(pNtk);
    return pAVar2;
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_SclBufferingPerform( Abc_Ntk_t * pNtk, SC_Lib * pLib, SC_BusPars * pPars )
{
    Abc_Ntk_t * pNtkNew;
    Bus_Man_t * p;
    if ( !Abc_SclCheckNtk( pNtk, 0 ) )
        return NULL;
    Abc_SclReportDupFanins( pNtk );
    Abc_SclMioGates2SclGates( pLib, pNtk );
    p = Bus_ManStart( pNtk, pLib, pPars );
    Bus_ManReadInOutLoads( p );
    Abc_SclBufSize( p, 0.01 * pPars->GainRatio );
    Bus_ManStop( p );
    Abc_SclSclGates2MioGates( pLib, pNtk );
    if ( pNtk->vPhases )
        Vec_IntFillExtra( pNtk->vPhases, Abc_NtkObjNumMax(pNtk), 0 );
    pNtkNew = Abc_NtkDupDfs( pNtk );
    return pNtkNew;
}